

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteCnf.c
# Opt level: O2

void Io_WriteCnfOutputPiMapping(FILE *pFile,int incrementVars)

{
  Abc_Ntk_t *pAVar1;
  Vec_Int_t *__ptr;
  char *pcVar2;
  long lVar3;
  
  pAVar1 = s_pNtk;
  __ptr = Abc_NtkGetCiSatVarNums(s_pNtk);
  fwrite("c PI variable numbers: <PI_name> <SAT_var_number>\n",0x32,1,(FILE *)pFile);
  lVar3 = 0;
  while( true ) {
    if (pAVar1->vCis->nSize <= lVar3) {
      free(__ptr->pArray);
      free(__ptr);
      return;
    }
    pcVar2 = Abc_ObjName((Abc_Obj_t *)pAVar1->vCis->pArray[lVar3]);
    if (__ptr->nSize <= lVar3) break;
    fprintf((FILE *)pFile,"c %s %d\n",pcVar2,
            (ulong)(__ptr->pArray[lVar3] + (uint)(0 < incrementVars)));
    lVar3 = lVar3 + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Io_WriteCnfOutputPiMapping( FILE * pFile, int incrementVars )
{
    extern Vec_Int_t * Abc_NtkGetCiSatVarNums( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pNtk = s_pNtk;
    Vec_Int_t * vCiIds;
    Abc_Obj_t * pObj;
    int i;
    vCiIds = Abc_NtkGetCiSatVarNums( pNtk );
    fprintf( pFile, "c PI variable numbers: <PI_name> <SAT_var_number>\n" );
    Abc_NtkForEachCi( pNtk, pObj, i )
        fprintf( pFile, "c %s %d\n", Abc_ObjName(pObj), Vec_IntEntry(vCiIds, i) + (int)(incrementVars > 0) );
    Vec_IntFree( vCiIds );
}